

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O3

void redrawSystem(int n)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 in_register_0000003c;
  bool bVar4;
  
  clear(CONCAT44(in_register_0000003c,n));
  refresh();
  if (grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data._M_finish
      != grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2].w_main,0,0);
      box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2].w_code,0,0);
      box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2].w_divider,0,0);
      wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar2].w_main);
      wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar2].w_reg);
      wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar2].w_code);
      wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar2].w_divider);
      uVar2 = ((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3;
      bVar4 = uVar3 <= uVar2;
      lVar1 = uVar2 - uVar3;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar4 && lVar1 != 0);
  }
  drawSystemContent();
  refresh();
  return;
}

Assistant:

void redrawSystem(int n){
  clear();
  refresh();
  for(unsigned int i=0;i<grid.size();i++){
      box(grid[i].w_main,0,0);
      box(grid[i].w_code,0,0);
      box(grid[i].w_divider,0,0);
      wrefresh(grid[i].w_main);
      wrefresh(grid[i].w_reg);
      wrefresh(grid[i].w_code);
      wrefresh(grid[i].w_divider);
      for(int j;j<4;j++){
	if(grid[i].arrows[j])
	  wrefresh(grid[i].arrows[j]->win);
      }
  }
  drawSystemContent();
  refresh();
  return;
}